

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O3

size_t replaceAll(string *str,char *oldValue,string *newValue)

{
  size_type sVar1;
  char *pcVar2;
  ulong uVar3;
  size_t sVar4;
  
  pcVar2 = (char *)strlen(oldValue);
  strlen(oldValue);
  sVar4 = 0;
  uVar3 = std::__cxx11::string::find((char *)str,(ulong)oldValue,0);
  if (uVar3 != 0xffffffffffffffff) {
    sVar4 = 0;
    do {
      std::__cxx11::string::replace((ulong)str,uVar3,pcVar2,(ulong)(newValue->_M_dataplus)._M_p);
      sVar1 = newValue->_M_string_length;
      sVar4 = sVar4 + 1;
      strlen(oldValue);
      uVar3 = std::__cxx11::string::find((char *)str,(ulong)oldValue,uVar3 + sVar1);
    } while (uVar3 != 0xffffffffffffffff);
  }
  return sVar4;
}

Assistant:

size_t replaceAll(std::string& str, const char* oldValue,const std::string& newValue)
{
	size_t pos = 0;
	size_t len = strlen(oldValue);

	size_t count = 0;
	while ((pos = str.find(oldValue, pos)) != std::string::npos)
	{
		str.replace(pos,len,newValue);
		pos += newValue.length();
		count++;
	}

	return count;
}